

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase355::run(TestCase355 *this)

{
  ArrayPtr<const_capnp::word> other;
  word *pwVar1;
  size_t sVar2;
  size_t in_RCX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar4;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_00;
  DebugExpression<bool> _kjCondition;
  Array<capnp::word> serialized;
  TestOutputStream output;
  TestMessageBuilder builder;
  DebugExpression<bool> local_179;
  Array<capnp::word> local_178;
  TestOutputStream local_158;
  StructBuilder local_128;
  undefined **local_100;
  StructBuilder in_stack_ffffffffffffff50;
  
  MallocMessageBuilder::MallocMessageBuilder((MallocMessageBuilder *)&local_100,0,FIXED_SIZE);
  local_100 = &PTR__TestMessageBuilder_003788a0;
  MessageBuilder::getRootInternal((Builder *)&local_178,(MessageBuilder *)&local_100);
  local_158.data._M_string_length = (size_type)local_178.disposer;
  local_158.super_OutputStream._vptr_OutputStream = (_func_int **)local_178.ptr;
  local_158.data._M_dataplus._M_p = (pointer)local_178.size_;
  PointerBuilder::initStruct(&local_128,(PointerBuilder *)&local_158,(StructSize)0x140006);
  initTestMessage((Builder)in_stack_ffffffffffffff50);
  AVar4 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&local_100);
  segments.ptr = (ArrayPtr<const_capnp::word> *)AVar4.size_;
  segments.size_ = in_RCX;
  messageToFlatArray(&local_178,(capnp *)AVar4.ptr,segments);
  paVar3 = &local_158.data.field_2;
  local_158.super_OutputStream._vptr_OutputStream = (_func_int **)&PTR__TestOutputStream_00378b38;
  local_158.data._M_string_length = 0;
  local_158.data.field_2._M_local_buf[0] = '\0';
  local_158.data._M_dataplus._M_p = (pointer)paVar3;
  AVar4 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&local_100);
  segments_00.ptr = (ArrayPtr<const_capnp::word> *)AVar4.size_;
  segments_00.size_ = (size_t)paVar3;
  writeMessage((capnp *)&local_158,(OutputStream *)AVar4.ptr,segments_00);
  other.size_ = local_178.size_;
  other.ptr = local_178.ptr;
  local_179.value = TestOutputStream::dataEquals(&local_158,other);
  if (kj::_::Debug::minSeverity < 3 && !local_179.value) {
    kj::_::Debug::log<char_const(&)[55],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-test.c++"
               ,0x16c,ERROR,
               "\"failed: expected \" \"output.dataEquals(serialized.asPtr())\", _kjCondition",
               (char (*) [55])"failed: expected output.dataEquals(serialized.asPtr())",&local_179);
  }
  TestOutputStream::~TestOutputStream(&local_158);
  sVar2 = local_178.size_;
  pwVar1 = local_178.ptr;
  if (local_178.ptr != (word *)0x0) {
    local_178.ptr = (word *)0x0;
    local_178.size_ = 0;
    (*(code *)**(undefined8 **)local_178.disposer)(local_178.disposer,pwVar1,8,sVar2,sVar2,0);
  }
  TestMessageBuilder::~TestMessageBuilder((TestMessageBuilder *)&local_100);
  return;
}

Assistant:

TEST(Serialize, WriteMessageOddSegmentCount) {
  TestMessageBuilder builder(7);
  initTestMessage(builder.initRoot<TestAllTypes>());

  kj::Array<word> serialized = messageToFlatArray(builder);

  TestOutputStream output;
  writeMessage(output, builder);

  EXPECT_TRUE(output.dataEquals(serialized.asPtr()));
}